

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnLeft(OptimizeInstructions *this,Binary *curr)

{
  BinaryOp BVar1;
  Expression *pEVar2;
  bool bVar3;
  bool bVar4;
  BinaryOp BVar5;
  int64_t iVar6;
  byte bVar7;
  EffectAnalyzer local_3f0;
  EffectAnalyzer local_290;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_130;
  long *local_108;
  undefined4 local_100;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_f8 [2];
  undefined1 local_c8 [40];
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  undefined8 local_90;
  undefined8 local_80;
  Const *local_60;
  Expression *right;
  long local_50;
  Const *c2;
  HeapType local_40;
  Const *c1;
  Expression *x;
  
  pEVar2 = curr->left;
  if (pEVar2->_id != ConstId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
  }
  c2 = (Const *)(pEVar2->type).id;
  bVar3 = false;
  if ((ulong)curr->op < 0x28) {
    bVar7 = 0;
    if ((0xf800007c00U >> ((ulong)curr->op & 0x3f) & 1) == 0) goto LAB_009e9e6b;
    bVar3 = Literal::isZero((Literal *)(pEVar2 + 1));
    if (bVar3) {
      EffectAnalyzer::EffectAnalyzer
                (&local_3f0,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,curr->right);
      bVar3 = true;
      bVar4 = true;
      if (local_3f0.trap == false) {
        bVar4 = EffectAnalyzer::hasNonTrapSideEffects(&local_3f0);
      }
      bVar7 = bVar4 ^ 1;
      goto LAB_009e9e6b;
    }
  }
  bVar3 = false;
  bVar7 = 0;
LAB_009e9e6b:
  if (bVar3) {
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_3f0.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_3f0.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_3f0.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_3f0.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_3f0.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_3f0.localsRead._M_t);
  }
  if (bVar7 == 0) {
    if ((Const *)0x6 < c2) {
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    BVar1 = curr->op;
    if ((((BVar1 == *(BinaryOp *)(&DAT_00e1652c + (long)c2 * 4)) ||
         (BVar1 == *(BinaryOp *)(&DAT_00e16390 + (long)c2 * 4))) ||
        (BVar1 == *(BinaryOp *)(&DAT_00e163ac + (long)c2 * 4))) &&
       (iVar6 = Literal::getInteger((Literal *)(pEVar2 + 1)), iVar6 == -1)) {
      EffectAnalyzer::EffectAnalyzer
                (&local_290,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,curr->right);
      bVar3 = true;
      bVar4 = true;
      if (local_290.trap == false) {
        bVar4 = EffectAnalyzer::hasNonTrapSideEffects(&local_290);
      }
      bVar7 = bVar4 ^ 1;
    }
    else {
      bVar3 = false;
      bVar7 = 0;
    }
    if (bVar3) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_290.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_290.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_290.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_290.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_290.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_290.localsRead._M_t);
    }
    if (bVar7 == 0) {
      local_130.submatchers.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
            *)&local_a0;
      local_90 = 0;
      local_80 = 0;
      local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_40;
      local_60 = (Const *)&c1;
      local_c8._16_8_ = &local_60;
      local_f8[0].curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
            *)0x0;
      local_f8[0].next._8_8_ = 0;
      local_c8._0_8_ = 0;
      local_c8._8_4_ = 3;
      local_130.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            *)0x0;
      local_130.data = Sub;
      local_130.submatchers.next.curr =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            *)local_c8;
      local_108 = &local_50;
      local_c8._24_8_ = &local_108;
      bVar3 = Match::Internal::
              Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
              ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                         *)&local_130,
                        (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                         )curr);
      if (bVar3) {
        Literal::sub((Literal *)&local_a0.func,(Literal *)(local_40.id + 0x10),
                     (Literal *)(local_50 + 0x10));
        Literal::operator=((Literal *)(pEVar2 + 1),(Literal *)&local_a0.func);
        Literal::~Literal((Literal *)&local_a0.func);
      }
      else {
        local_90 = 0;
        local_80 = 0;
        local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_40;
        local_f8[0].curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
              *)0x0;
        local_f8[0].next._8_8_ = 0;
        local_60 = (Const *)&c1;
        local_c8._0_8_ = 0;
        local_c8._8_4_ = 4;
        local_c8._24_8_ = &local_60;
        local_130.binder =
             (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
              *)0x0;
        local_130.data = Sub;
        local_130.submatchers.curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
              *)&local_a0;
        local_130.submatchers.next.curr =
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)local_c8;
        local_108 = &local_50;
        local_c8._16_8_ = &local_108;
        bVar3 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                ::matches(&local_130,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        if (bVar3) {
          Literal::sub((Literal *)&local_a0.func,(Literal *)(local_40.id + 0x10),
                       (Literal *)(local_50 + 0x10));
          Literal::operator=((Literal *)(pEVar2 + 1),(Literal *)&local_a0.func);
          Literal::~Literal((Literal *)&local_a0.func);
          curr->op = *(BinaryOp *)(&DAT_00e1658c + (long)c2 * 4);
          pEVar2 = curr->left;
          curr->left = (Expression *)c1;
          curr->right = pEVar2;
          return (Expression *)curr;
        }
        local_90 = 0;
        local_80 = 0;
        local_a0.i64 = 0;
        local_c8._0_8_ = &local_60;
        local_130.binder =
             (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
              *)0x0;
        local_130.data = Neg;
        local_108 = (long *)0x0;
        local_100 = 7;
        local_f8[0].curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
              *)&local_a0;
        if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id !=
              BinaryId) ||
            (BVar1 = curr->op,
            local_130.submatchers.curr =
                 (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                  *)local_c8,
            local_f8[0].next.curr =
                 (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                  *)&local_130, BVar5 = Abstract::getBinary((Type)(curr->left->type).id,DivS),
            BVar1 != BVar5)) ||
           (bVar3 = Match::Internal::
                    Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                    ::match(curr,local_f8), !bVar3)) {
          return (Expression *)0x0;
        }
        Literal::neg((Literal *)&local_a0.func,(Literal *)(pEVar2 + 1));
        Literal::operator=((Literal *)(pEVar2 + 1),(Literal *)&local_a0.func);
        Literal::~Literal((Literal *)&local_a0.func);
        c1 = local_60;
      }
      curr->right = (Expression *)c1;
      return (Expression *)curr;
    }
  }
  return curr->left;
}

Assistant:

Expression* optimizeWithConstantOnLeft(Binary* curr) {
    using namespace Match;
    using namespace Abstract;

    auto type = curr->left->type;
    auto* left = curr->left->cast<Const>();
    // 0 <<>> x   ==>   0
    if (Abstract::hasAnyShift(curr->op) && left->value.isZero() &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    // (signed)-1 >> x   ==>   -1
    // rotl(-1, x)       ==>   -1
    // rotr(-1, x)       ==>   -1
    if ((curr->op == Abstract::getBinary(type, ShrS) ||
         curr->op == Abstract::getBinary(type, RotL) ||
         curr->op == Abstract::getBinary(type, RotR)) &&
        left->value.getInteger() == -1LL &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    {
      // C1 - (x + C2)  ==>  (C1 - C2) - x
      Const *c1, *c2;
      Expression* x;
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Add, any(&x), ival(&c2))))) {
        left->value = c1->value.sub(c2->value);
        curr->right = x;
        return curr;
      }
      // C1 - (C2 - x)  ==>   x + (C1 - C2)
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Sub, ival(&c2), any(&x))))) {
        left->value = c1->value.sub(c2->value);
        curr->op = Abstract::getBinary(type, Add);
        curr->right = x;
        std::swap(curr->left, curr->right);
        return curr;
      }
    }
    {
      // fval(C) / -x   ==>  -C / x
      Expression* right;
      if (matches(curr, binary(DivS, fval(), unary(Neg, any(&right))))) {
        left->value = left->value.neg();
        curr->right = right;
        return curr;
      }
    }
    return nullptr;
  }